

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::format<char[13],int,int,int,char[42]>
          (bilingual_str *fmt,char (*args) [13],int *args_1,int *args_2,int *args_3,
          char (*args_4) [42])

{
  long lVar1;
  string *fmt_00;
  char (*pacVar2) [42];
  char (*in_RSI) [13];
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  char (*in_stack_00000100) [42];
  undefined8 in_stack_ffffffffffffff18;
  bool translated;
  undefined1 translated_00;
  char (*in_stack_ffffffffffffff20) [42];
  anon_class_1_0_00000001 *in_stack_ffffffffffffff28;
  bilingual_str *args_2_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar3;
  
  translated = SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  args_2_00 = in_RDI;
  fmt_00 = (string *)
           format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
           ::{lambda(auto:1_const&,bool)#1}::operator()
                     (in_stack_ffffffffffffff28,(char (*) [13])in_stack_ffffffffffffff20,translated)
  ;
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,translated);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,translated);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,translated);
  pacVar2 = format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,translated);
  translated_00 = (undefined1)((ulong)pacVar2 >> 0x38);
  format<char[13],int,int,int,char[42]>
            (fmt_00,in_RSI,(int *)CONCAT44(uVar3,in_stack_ffffffffffffff58),(int *)args_2_00,
             (int *)in_RDI,in_stack_00000100);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(char (*) [13])in_stack_ffffffffffffff20,(bool)translated_00)
  ;
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,(bool)translated_00);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,(bool)translated_00);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20,(bool)translated_00);
  format<char[13],int,int,int,char[42]>(bilingual_str_const&,char_const(&)[13],int_const&,int_const&,int_const&,char_const(&)[42])
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(bool)translated_00);
  format<char[13],int,int,int,char[42]>
            (fmt_00,in_RSI,(int *)CONCAT44(uVar3,in_stack_ffffffffffffff58),(int *)args_2_00,
             (int *)in_RDI,in_stack_00000100);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}